

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSProperty * add_property(JSContext *ctx,JSObject *p,JSAtom prop,int prop_flags)

{
  JSShape **psh;
  JSShape **ppJVar1;
  uint uVar2;
  int iVar3;
  JSShape *pJVar4;
  JSProperty *pJVar5;
  ulong uVar6;
  ulong uVar7;
  JSRuntime *pJVar8;
  JSShape *pJVar9;
  
  psh = &p->shape;
  pJVar4 = p->shape;
  if (pJVar4->is_hashed != '\0') {
    pJVar8 = ctx->rt;
    uVar2 = ((pJVar4->hash + prop) * -0x61c8ffff + prop_flags) * -0x61c8ffff;
    for (pJVar9 = pJVar8->shape_hash[uVar2 >> (-(char)pJVar8->shape_hash_bits & 0x1fU)];
        pJVar9 != (JSShape *)0x0; pJVar9 = pJVar9->shape_hash_next) {
      if (((pJVar9->hash == uVar2) && (pJVar9->proto == pJVar4->proto)) &&
         (uVar6 = (ulong)(uint)pJVar4->prop_count, pJVar9->prop_count == pJVar4->prop_count + 1U)) {
        if (uVar6 == 0) {
          uVar6 = 0;
        }
        else {
          uVar7 = 0;
          do {
            if ((*(int *)(&pJVar9[1].header.field_0x4 + uVar7 * 8) !=
                 *(int *)(&pJVar4[1].header.field_0x4 + uVar7 * 8)) ||
               (0x3ffffff <
                (uint)((&pJVar4[1].header.ref_count)[uVar7 * 2] ^
                      (&pJVar9[1].header.ref_count)[uVar7 * 2]))) goto LAB_0011f50a;
            uVar7 = uVar7 + 1;
          } while (uVar6 != uVar7);
        }
        if ((*(JSAtom *)(&pJVar9[1].header.field_0x4 + uVar6 * 8) == prop) &&
           ((uint)(&pJVar9[1].header.ref_count)[uVar6 * 2] >> 0x1a == prop_flags)) {
          if (pJVar9->prop_size != pJVar4->prop_size) {
            pJVar5 = (JSProperty *)js_realloc(ctx,p->prop,(long)pJVar9->prop_size << 4);
            if (pJVar5 == (JSProperty *)0x0) {
              return (JSProperty *)0x0;
            }
            p->prop = pJVar5;
            pJVar8 = ctx->rt;
          }
          (pJVar9->header).ref_count = (pJVar9->header).ref_count + 1;
          *psh = pJVar9;
          iVar3 = (pJVar4->header).ref_count;
          (pJVar4->header).ref_count = iVar3 + -1;
          if (iVar3 < 2) {
            js_free_shape0(pJVar8,pJVar4);
          }
          goto LAB_0011f5e1;
        }
      }
LAB_0011f50a:
    }
    if ((pJVar4->header).ref_count != 1) {
      pJVar4 = js_clone_shape(ctx,pJVar4);
      if (pJVar4 == (JSShape *)0x0) {
        return (JSProperty *)0x0;
      }
      pJVar4->is_hashed = '\x01';
      pJVar8 = ctx->rt;
      uVar2 = pJVar4->hash >> (-(char)pJVar8->shape_hash_bits & 0x1fU);
      ppJVar1 = pJVar8->shape_hash;
      pJVar4->shape_hash_next = ppJVar1[uVar2];
      ppJVar1[uVar2] = pJVar4;
      pJVar8->shape_hash_count = pJVar8->shape_hash_count + 1;
      pJVar8 = ctx->rt;
      pJVar9 = *psh;
      iVar3 = (pJVar9->header).ref_count;
      (pJVar9->header).ref_count = iVar3 + -1;
      if (iVar3 < 2) {
        js_free_shape0(pJVar8,pJVar9);
      }
      *psh = pJVar4;
    }
  }
  iVar3 = add_shape_property(ctx,psh,p,prop,prop_flags);
  if (iVar3 != 0) {
    return (JSProperty *)0x0;
  }
  pJVar9 = *psh;
LAB_0011f5e1:
  return p->prop + (long)pJVar9->prop_count + -1;
}

Assistant:

static JSProperty *add_property(JSContext *ctx,
                                JSObject *p, JSAtom prop, int prop_flags)
{
    JSShape *sh, *new_sh;

    sh = p->shape;
    if (sh->is_hashed) {
        /* try to find an existing shape */
        new_sh = find_hashed_shape_prop(ctx->rt, sh, prop, prop_flags);
        if (new_sh) {
            /* matching shape found: use it */
            /*  the property array may need to be resized */
            if (new_sh->prop_size != sh->prop_size) {
                JSProperty *new_prop;
                new_prop = js_realloc(ctx, p->prop, sizeof(p->prop[0]) *
                                      new_sh->prop_size);
                if (!new_prop)
                    return NULL;
                p->prop = new_prop;
            }
            p->shape = js_dup_shape(new_sh);
            js_free_shape(ctx->rt, sh);
            return &p->prop[new_sh->prop_count - 1];
        } else if (sh->header.ref_count != 1) {
            /* if the shape is shared, clone it */
            new_sh = js_clone_shape(ctx, sh);
            if (!new_sh)
                return NULL;
            /* hash the cloned shape */
            new_sh->is_hashed = TRUE;
            js_shape_hash_link(ctx->rt, new_sh);
            js_free_shape(ctx->rt, p->shape);
            p->shape = new_sh;
        }
    }
    assert(p->shape->header.ref_count == 1);
    if (add_shape_property(ctx, &p->shape, p, prop, prop_flags))
        return NULL;
    return &p->prop[p->shape->prop_count - 1];
}